

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# division.h
# Opt level: O0

void __thiscall Division_Simple_Test::~Division_Simple_Test(Division_Simple_Test *this)

{
  Division_Simple_Test *this_local;
  
  ~Division_Simple_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Division, Simple)
{
    BigNumber num_1 = BigNumber("1") / BigNumber("1");
    BigNumber num_2 = BigNumber("1") / BigNumber("-1");
    BigNumber num_3 = BigNumber("-1") / BigNumber("1");
    BigNumber num_4 = BigNumber("-1") / BigNumber("-1");
    BigNumber num_5 = BigNumber("1") % BigNumber("1");
    BigNumber num_6 = BigNumber("1") % BigNumber("-1");
    BigNumber num_7 = BigNumber("-1") % BigNumber("1");
    BigNumber num_8 = BigNumber("-1") % BigNumber("-1");
    EXPECT_EQ("1", num_1.toString());
    EXPECT_EQ("-1", num_2.toString());
    EXPECT_EQ("-1", num_3.toString());
    EXPECT_EQ("1", num_4.toString());
    EXPECT_EQ("0", num_5.toString());
    EXPECT_EQ("0", num_6.toString());
    EXPECT_EQ("0", num_7.toString());
    EXPECT_EQ("0", num_8.toString());
}